

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

XmlWriter * __thiscall
Catch::XmlWriter::startElement(XmlWriter *this,string *name,XmlFormatting fmt)

{
  bool bVar1;
  ostream *poVar2;
  XmlFormatting fmt_local;
  string *name_local;
  XmlWriter *this_local;
  
  ensureTagClosed(this);
  newlineIfNecessary(this);
  bVar1 = anon_unknown_26::shouldIndent(fmt);
  if (bVar1) {
    std::operator<<(this->m_os,(string *)&this->m_indent);
    std::__cxx11::string::operator+=((string *)&this->m_indent,"  ");
  }
  poVar2 = std::operator<<(this->m_os,'<');
  std::operator<<(poVar2,(string *)name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->m_tags,name);
  this->m_tagIsOpen = true;
  applyFormatting(this,fmt);
  return this;
}

Assistant:

XmlWriter& XmlWriter::startElement( std::string const& name, XmlFormatting fmt ) {
        ensureTagClosed();
        newlineIfNecessary();
        if (shouldIndent(fmt)) {
            m_os << m_indent;
            m_indent += "  ";
        }
        m_os << '<' << name;
        m_tags.push_back( name );
        m_tagIsOpen = true;
        applyFormatting(fmt);
        return *this;
    }